

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cond_ineq.h
# Opt level: O0

void __thiscall
mp::
Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>_>
::ConvertCtxNeg(Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_>
                *this,ItemType *cc,int param_3)

{
  double eps_output;
  int kind_output;
  double in_stack_00000388;
  int in_stack_00000394;
  ItemType *in_stack_00000398;
  Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_>
  *in_stack_000003a0;
  
  ConvertCondIneq<1>(in_stack_000003a0,in_stack_00000398,in_stack_00000394,in_stack_00000388);
  return;
}

Assistant:

void ConvertCtxNeg(const ItemType& cc, int ) {
    constexpr auto kind_output =               // output comparison is <= or >=
        ( kind_input>0 ) ? -1 : 1;             // even for < or >
    auto eps_output =
        ( kind_input==1 || kind_input==-1 ) ?  // non-strict comparison?
          kind_output *
            GetMC().ComparisonEps(   // 1 for integer expressions
              GetMC().ComputeBoundsAndType(cc.GetArguments()).
              get_result_type() ) :
          0.0;
    ConvertCondIneq<kind_output>(cc, 0, eps_output);
  }